

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireTest_tryPullOutCardsFromTableauPileWithIdGreaterThanSix_Test::TestBody
          (SolitaireTest_tryPullOutCardsFromTableauPileWithIdGreaterThanSix_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_90;
  Message local_88 [2];
  runtime_error *anon_var_0;
  type e;
  byte local_45;
  bool gtest_caught_expected;
  undefined1 auStack_38 [8];
  TrueWithString gtest_msg;
  SolitaireTest_tryPullOutCardsFromTableauPileWithIdGreaterThanSix_Test *this_local;
  
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_38 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_38);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_38);
  if (bVar1) {
    local_45 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      piles::PileId::PileId
                ((PileId *)((long)&e + 4),(PileId *)&(anonymous_namespace)::invalidTableauPileId);
      Solitaire::tryPullOutCardsFromTableauPile
                (&(this->super_SolitaireTest).solitaire,(PileId *)((long)&e + 4),2);
    }
    if ((local_45 & 1) != 0) goto LAB_001b172d;
    std::__cxx11::string::operator=
              ((string *)auStack_38,
               "Expected: solitaire.tryPullOutCardsFromTableauPile(invalidTableauPileId, quantityToPullOut) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_88);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x8d,message);
  testing::internal::AssertHelper::operator=(&local_90,local_88);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  testing::Message::~Message(local_88);
LAB_001b172d:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_38);
  return;
}

Assistant:

TEST_F(SolitaireTest, tryPullOutCardsFromTableauPileWithIdGreaterThanSix) {
    EXPECT_THROW(
        solitaire.tryPullOutCardsFromTableauPile(invalidTableauPileId, quantityToPullOut),
        std::runtime_error
    );
}